

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O1

Gnuplot * __thiscall Gnuplot::showonscreen(Gnuplot *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"set output","");
  cmd(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_40,"set terminal ",&terminal_std_abi_cxx11_);
  cmd(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

Gnuplot& Gnuplot::showonscreen() {
  cmd("set output");
  cmd("set terminal "+ Gnuplot::terminal_std);
  return *this;
}